

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktFragmentOperationsScissorMultiViewportTests.cpp
# Opt level: O0

void __thiscall
vkt::FragmentOperations::anon_unknown_0::ScissorRenderer::draw
          (ScissorRenderer *this,Context *context,VkBuffer colorBuffer)

{
  VkCommandBuffer_s *pVVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  VkResult result;
  DeviceInterface *vk_00;
  VkDevice device_00;
  VkQueue queue_00;
  VkCommandBuffer_s **ppVVar4;
  Handle<(vk::HandleType)17> *pHVar5;
  Handle<(vk::HandleType)23> *pHVar6;
  Handle<(vk::HandleType)18> *pHVar7;
  Handle<(vk::HandleType)8> *pHVar8;
  Handle<(vk::HandleType)9> *pHVar9;
  VkCommandPool *this_00;
  VkOffset3D VVar10;
  VkExtent3D VVar11;
  undefined4 local_198 [2];
  VkBufferMemoryBarrier barriers_1 [1];
  deInt32 local_150;
  deInt32 dStack_14c;
  deUint32 local_148;
  deUint32 local_140;
  deUint32 dStack_13c;
  deInt32 local_138;
  undefined8 local_130;
  VkBufferImageCopy region;
  VkImageMemoryBarrier barriers [1];
  undefined8 local_a8;
  VkDeviceSize vertexBufferOffset;
  undefined4 local_98 [2];
  VkRenderPassBeginInfo renderPassBeginInfo;
  VkRect2D renderArea;
  VkClearValue clearValue;
  VkQueue queue;
  VkDevice device;
  DeviceInterface *vk;
  Context *context_local;
  ScissorRenderer_conflict *this_local;
  VkBuffer colorBuffer_local;
  
  vk_00 = Context::getDeviceInterface(context);
  device_00 = Context::getDevice(context);
  queue_00 = Context::getUniversalQueue(context);
  this_00 = &(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool;
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)this_00);
  beginCommandBuffer(vk_00,*ppVVar4);
  join_0x00000010_0x00000000_ = ::vk::makeClearValueColor(&this->m_primitiveColor);
  renderPassBeginInfo.pClearValues = (VkClearValue *)::vk::makeOffset2D(0,0);
  dVar2 = tcu::Vector<int,_2>::x(&this->m_renderSize);
  dVar3 = tcu::Vector<int,_2>::y(&this->m_renderSize);
  renderArea.offset = (VkOffset2D)::vk::makeExtent2D(dVar2,dVar3);
  local_98[0] = 0x2b;
  renderPassBeginInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  renderPassBeginInfo._4_4_ = 0;
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)17>_> *)
                      &(this->m_fragmentModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.
                       m_data.deleter.m_allocator);
  renderPassBeginInfo.pNext = (void *)pHVar5->m_internal;
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)23>_> *)
                      &(this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.
                       deleter.m_allocator);
  renderPassBeginInfo.renderPass.m_internal = pHVar6->m_internal;
  renderPassBeginInfo.framebuffer.m_internal = (deUint64)renderPassBeginInfo.pClearValues;
  renderPassBeginInfo.renderArea.offset = renderArea.offset;
  renderPassBeginInfo.renderArea.extent.width = 1;
  renderPassBeginInfo._48_8_ = &renderArea.extent;
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)this_00);
  (*vk_00->_vptr_DeviceInterface[0x74])(vk_00,*ppVVar4,local_98,0);
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)this_00);
  pVVar1 = *ppVVar4;
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)18>_> *)
                      &(this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.
                       m_data.deleter.m_allocator);
  vertexBufferOffset = pHVar7->m_internal;
  (*vk_00->_vptr_DeviceInterface[0x4c])(vk_00,pVVar1,0,vertexBufferOffset);
  local_a8 = 0;
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)this_00);
  pVVar1 = *ppVVar4;
  pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::get
                     ((RefBase<vk::Handle<(vk::HandleType)8>_> *)
                      &(this->m_colorImageAlloc).
                       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                       field_0x8);
  (*vk_00->_vptr_DeviceInterface[0x58])(vk_00,pVVar1,0,1,pHVar8,&local_a8);
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)this_00);
  (*vk_00->_vptr_DeviceInterface[0x59])
            (vk_00,*ppVVar4,(ulong)(uint)(this->m_clearColor).m_data[0],1,0);
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)this_00);
  (*vk_00->_vptr_DeviceInterface[0x76])(vk_00,*ppVVar4);
  region.imageExtent.height = 0x2d;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
            ((RefBase<vk::Handle<(vk::HandleType)9>_> *)&this->m_vertices);
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)this_00);
  (*vk_00->_vptr_DeviceInterface[0x6d])
            (vk_00,*ppVVar4,0x400,0x1000,0,0,0,0,0,1,&region.imageExtent.height);
  local_130 = 0;
  region.bufferOffset._0_4_ = 0;
  region.bufferOffset._4_4_ = 0;
  region._8_16_ = ::vk::makeImageSubresourceLayers(1,0,0,1);
  VVar10 = ::vk::makeOffset3D(0,0,0);
  local_138 = VVar10.z;
  region.imageOffset.x = local_138;
  _local_140 = VVar10._0_8_;
  region.imageSubresource.baseArrayLayer = local_140;
  region.imageSubresource.layerCount = dStack_13c;
  dVar2 = tcu::Vector<int,_2>::x(&this->m_renderSize);
  dVar3 = tcu::Vector<int,_2>::y(&this->m_renderSize);
  VVar11 = ::vk::makeExtent3D(dVar2,dVar3,1);
  _local_150 = VVar11._0_8_;
  region.imageOffset.y = local_150;
  region.imageOffset.z = dStack_14c;
  local_148 = VVar11.depth;
  region.imageExtent.width = local_148;
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)
                       &(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.
                        m_pool);
  pVVar1 = *ppVVar4;
  pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)9>_> *)&this->m_vertices);
  barriers_1[0].size = colorBuffer.m_internal;
  (*vk_00->_vptr_DeviceInterface[99])
            (vk_00,pVVar1,pHVar9->m_internal,6,colorBuffer.m_internal,1,&local_130);
  local_198[0] = 0x2c;
  barriers_1[0].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  barriers_1[0]._4_4_ = 0;
  barriers_1[0].pNext._0_4_ = 0x1000;
  barriers_1[0].pNext._4_4_ = 0x2000;
  barriers_1[0].srcAccessMask = 0xffffffff;
  barriers_1[0].dstAccessMask = 0xffffffff;
  barriers_1[0].buffer.m_internal = 0;
  barriers_1[0].offset = 0xffffffffffffffff;
  barriers_1[0]._24_8_ = colorBuffer.m_internal;
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)
                       &(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.
                        m_pool);
  (*vk_00->_vptr_DeviceInterface[0x6d])(vk_00,*ppVVar4,0x1000,0x4000,0,0,0,1,local_198,0,0);
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)
                       &(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.
                        m_pool);
  result = (*vk_00->_vptr_DeviceInterface[0x4a])(vk_00,*ppVVar4);
  ::vk::checkResult(result,"vk.endCommandBuffer(*m_cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/fragment_ops/vktFragmentOperationsScissorMultiViewportTests.cpp"
                    ,0x2ac);
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)
                       &(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.
                        m_pool);
  submitCommandsAndWait(vk_00,device_00,queue_00,*ppVVar4);
  return;
}

Assistant:

void draw (Context& context, const VkBuffer colorBuffer) const
	{
		const DeviceInterface&		vk			= context.getDeviceInterface();
		const VkDevice				device		= context.getDevice();
		const VkQueue				queue		= context.getUniversalQueue();

		beginCommandBuffer(vk, *m_cmdBuffer);

		const VkClearValue			clearValue	= makeClearValueColor(m_clearColor);
		const VkRect2D				renderArea	=
		{
			makeOffset2D(0, 0),
			makeExtent2D(m_renderSize.x(), m_renderSize.y()),
		};
		const VkRenderPassBeginInfo renderPassBeginInfo =
		{
			VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO,		// VkStructureType         sType;
			DE_NULL,										// const void*             pNext;
			*m_renderPass,									// VkRenderPass            renderPass;
			*m_framebuffer,									// VkFramebuffer           framebuffer;
			renderArea,										// VkRect2D                renderArea;
			1u,												// uint32_t                clearValueCount;
			&clearValue,									// const VkClearValue*     pClearValues;
		};
		vk.cmdBeginRenderPass(*m_cmdBuffer, &renderPassBeginInfo, VK_SUBPASS_CONTENTS_INLINE);

		vk.cmdBindPipeline(*m_cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *m_pipeline);
		{
			const VkDeviceSize vertexBufferOffset = 0ull;
			vk.cmdBindVertexBuffers(*m_cmdBuffer, 0u, 1u, &m_vertexBuffer.get(), &vertexBufferOffset);
		}
		vk.cmdDraw(*m_cmdBuffer, static_cast<deUint32>(m_numViewports), 1u, 0u, 0u);	// one vertex per viewport
		vk.cmdEndRenderPass(*m_cmdBuffer);

		// Prepare color image for copy
		{
			const VkImageMemoryBarrier barriers[] =
			{
				{
					VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,						// VkStructureType			sType;
					DE_NULL,													// const void*				pNext;
					VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,						// VkAccessFlags			outputMask;
					VK_ACCESS_TRANSFER_READ_BIT,								// VkAccessFlags			inputMask;
					VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,					// VkImageLayout			oldLayout;
					VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,						// VkImageLayout			newLayout;
					VK_QUEUE_FAMILY_IGNORED,									// deUint32					srcQueueFamilyIndex;
					VK_QUEUE_FAMILY_IGNORED,									// deUint32					destQueueFamilyIndex;
					*m_colorImage,												// VkImage					image;
					m_colorSubresourceRange,									// VkImageSubresourceRange	subresourceRange;
				},
			};

			vk.cmdPipelineBarrier(*m_cmdBuffer, VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u,
				0u, DE_NULL, 0u, DE_NULL, DE_LENGTH_OF_ARRAY(barriers), barriers);
		}
		// Color image -> host buffer
		{
			const VkBufferImageCopy region =
			{
				0ull,																		// VkDeviceSize                bufferOffset;
				0u,																			// uint32_t                    bufferRowLength;
				0u,																			// uint32_t                    bufferImageHeight;
				makeImageSubresourceLayers(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 0u, 1u),			// VkImageSubresourceLayers    imageSubresource;
				makeOffset3D(0, 0, 0),														// VkOffset3D                  imageOffset;
				makeExtent3D(m_renderSize.x(), m_renderSize.y(), 1u),						// VkExtent3D                  imageExtent;
			};

			vk.cmdCopyImageToBuffer(*m_cmdBuffer, *m_colorImage, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, colorBuffer, 1u, &region);
		}
		// Buffer write barrier
		{
			const VkBufferMemoryBarrier barriers[] =
			{
				{
					VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,		// VkStructureType    sType;
					DE_NULL,										// const void*        pNext;
					VK_ACCESS_TRANSFER_WRITE_BIT,					// VkAccessFlags      srcAccessMask;
					VK_ACCESS_HOST_READ_BIT,						// VkAccessFlags      dstAccessMask;
					VK_QUEUE_FAMILY_IGNORED,						// uint32_t           srcQueueFamilyIndex;
					VK_QUEUE_FAMILY_IGNORED,						// uint32_t           dstQueueFamilyIndex;
					colorBuffer,									// VkBuffer           buffer;
					0ull,											// VkDeviceSize       offset;
					VK_WHOLE_SIZE,									// VkDeviceSize       size;
				},
			};

			vk.cmdPipelineBarrier(*m_cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
				0u, DE_NULL, DE_LENGTH_OF_ARRAY(barriers), barriers, DE_NULL, 0u);
		}

		VK_CHECK(vk.endCommandBuffer(*m_cmdBuffer));
		submitCommandsAndWait(vk, device, queue, *m_cmdBuffer);
	}